

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * mi_heap_try_new(mi_heap_t *heap,size_t size,_Bool nothrow)

{
  void *p;
  undefined7 in_stack_ffffffffffffffd8;
  _Bool _Var1;
  mi_heap_t *heap_00;
  
  heap_00 = (mi_heap_t *)0x0;
  while( true ) {
    _Var1 = false;
    if (heap_00 == (mi_heap_t *)0x0) {
      _Var1 = mi_try_new_handler(false);
    }
    if (_Var1 == false) break;
    heap_00 = (mi_heap_t *)mi_heap_malloc(heap_00,CONCAT17(_Var1,in_stack_ffffffffffffffd8));
  }
  return heap_00;
}

Assistant:

void* mi_heap_try_new(mi_heap_t* heap, size_t size, bool nothrow ) {
  void* p = NULL;
  while(p == NULL && mi_try_new_handler(nothrow)) {
    p = mi_heap_malloc(heap,size);
  }
  return p;
}